

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::WritePWM(AmpIO *this,uint index,double freq,double duty)

{
  uint8_t mask;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  ostream *poVar4;
  uint uVar5;
  long lVar6;
  uint8_t bits;
  uint uVar7;
  long lVar8;
  
  if (375.0 < freq) {
    if (duty < 0.0) {
      return false;
    }
    if (1.0 < duty) {
      return false;
    }
    uVar3 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar3 == 0x64524131) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"AmpIO::WritePWM not implemented for dRAC");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      lVar8 = (long)((duty / freq) * 49152000.0 + 0.5);
      uVar7 = (uint)lVar8;
      if (uVar7 < 0x10000) {
        lVar6 = (long)(((1.0 - duty) / freq) * 49152000.0 + 0.5);
        uVar5 = (uint)lVar6;
        if ((uVar5 < 0x10000) && (uVar5 != 0 || uVar7 != 0)) {
          if (uVar7 == 0) {
            bVar1 = WriteDoutControl(this,index,0,0);
            mask = (uint8_t)(1 << ((byte)index & 0x1f));
            bits = '\0';
          }
          else {
            if (uVar5 != 0) {
              bVar1 = WriteDoutControl(this,index,(uint16_t)lVar8,(uint16_t)lVar6);
              return bVar1;
            }
            bVar1 = WriteDoutControl(this,index,0,0);
            bits = '\x01';
            mask = (uint8_t)(1 << ((byte)index & 0x1f));
          }
          bVar2 = WriteDigitalOutput(this,mask,bits);
          return (bool)(bVar2 & bVar1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AmpIO::WritePWM(unsigned int index, double freq, double duty)
{
    // Check for valid frequency (also avoid divide by 0)
    if (freq <= 375.0) return false;
    // Check for valid duty cycle (0-1)
    if ((duty < 0.0) || (duty > 1.0)) return false;

    if (GetHardwareVersion() == dRA1_String) {
        std::cerr << "AmpIO::WritePWM not implemented for dRAC" << std::endl;
        return false;
    }

    // Compute high time and low time (in counts). Note that we return false
    // if either time is greater than 16 bits, rather than attempting to adjust.
    // Starting with Version 1.3.0 of this library, digital outputs are inverted
    // to match the actual output. This function does not need to be changed,
    // however,  because the inversion is performed in WriteDoutControl and
    // WriteDigitalOutput.
    uint32_t highTime = GetDoutCounts(duty/freq);
    if (highTime > 65535L) return false;
    uint32_t lowTime = GetDoutCounts((1.0-duty)/freq);
    if (lowTime > 65535L) return false;
    // Following can occur if frequency is too high
    if ((highTime == 0) && (lowTime == 0)) return false;
    bool ret;
    // If highTime is 0, then turn off PWM at low value
    if (highTime == 0) {
        ret = WriteDoutControl(index, 0, 0);
        ret &= WriteDigitalOutput((1<<index), 0);
    }
    // If lowTime is 0, then turn off PWM at high value
    else if (lowTime == 0) {
        ret = WriteDoutControl(index, 0, 0);
        ret &= WriteDigitalOutput((1<<index), 1);
    }
    else
        ret = WriteDoutControl(index, static_cast<uint16_t>(highTime), static_cast<uint16_t>(lowTime));
    return ret;
}